

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O2

void Abc_NodeFromMapCutPhase(Abc_Ntk_t *pNtkNew,Map_Cut_t *pCut,int fPhase)

{
  uint uVar1;
  uint nNodePis;
  Map_Super_t *pSuper;
  Map_Node_t **ppMVar2;
  Abc_Obj_t *pAVar3;
  ulong uVar4;
  ulong uVar5;
  Abc_Obj_t *pNodePIs [10];
  Abc_Obj_t *local_88 [11];
  
  pSuper = Map_CutReadSuperBest(pCut,fPhase);
  if (pSuper != (Map_Super_t *)0x0) {
    uVar1 = Map_CutReadPhaseBest(pCut,fPhase);
    nNodePis = Map_CutReadLeavesNum(pCut);
    ppMVar2 = Map_CutReadLeaves(pCut);
    uVar5 = 0;
    uVar4 = (ulong)nNodePis;
    if ((int)nNodePis < 1) {
      uVar4 = uVar5;
    }
    while (uVar4 != uVar5) {
      pAVar3 = (Abc_Obj_t *)
               Map_NodeReadData(ppMVar2[uVar5],(uint)((~uVar1 >> ((uint)uVar5 & 0x1f) & 1) != 0));
      local_88[uVar5] = pAVar3;
      uVar5 = uVar5 + 1;
      if (pAVar3 == (Abc_Obj_t *)0x0) {
        __assert_fail("pNodePIs[i] != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                      ,0x2cc,"void Abc_NodeFromMapCutPhase(Abc_Ntk_t *, Map_Cut_t *, int)");
      }
    }
    Abc_NodeFromMapSuperChoice_rec(pNtkNew,pSuper,local_88,nNodePis);
  }
  return;
}

Assistant:

void Abc_NodeFromMapCutPhase( Abc_Ntk_t * pNtkNew, Map_Cut_t * pCut, int fPhase )
{
    Abc_Obj_t * pNodePIs[10];
    Map_Node_t ** ppLeaves;
    Map_Super_t * pSuperBest;
    unsigned uPhaseBest;
    int i, fInvPin, nLeaves;

    pSuperBest = Map_CutReadSuperBest( pCut, fPhase );
    if ( pSuperBest == NULL )
        return;

    // get the information about the best cut 
    uPhaseBest = Map_CutReadPhaseBest( pCut, fPhase );
    nLeaves    = Map_CutReadLeavesNum( pCut );
    ppLeaves   = Map_CutReadLeaves( pCut );

    // collect the PI nodes
    for ( i = 0; i < nLeaves; i++ )
    {
        fInvPin = ((uPhaseBest & (1 << i)) > 0);
        pNodePIs[i] = (Abc_Obj_t *)Map_NodeReadData( ppLeaves[i], !fInvPin );
        assert( pNodePIs[i] != NULL );
    }

    // implement the supergate
    Abc_NodeFromMapSuperChoice_rec( pNtkNew, pSuperBest, pNodePIs, nLeaves );
}